

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zone.h
# Opt level: O0

ConstPoolNode * __thiscall
asmjit::v1_14::ZoneAllocator::newT<asmjit::v1_14::ConstPoolNode,asmjit::v1_14::BaseBuilder*>
          (ZoneAllocator *this,BaseBuilder **args)

{
  ConstPoolNode *zone;
  long *in_RSI;
  void *p;
  size_t in_stack_fffffffffffffef8;
  ZoneAllocator *in_stack_ffffffffffffff00;
  ConstPoolNode *pCVar1;
  ConstPoolNode *local_d0;
  ConstPoolNode *local_c8;
  long *local_c0;
  ConstPoolNode *local_b0;
  ConstPoolNode **local_a8;
  undefined8 local_a0;
  undefined4 local_94;
  long local_90;
  ConstPoolNode *local_88;
  undefined4 local_3c;
  long local_38;
  ConstPoolNode *local_30;
  undefined1 local_24;
  undefined1 local_23;
  undefined1 local_22;
  undefined1 local_21;
  long local_20;
  ConstPoolNode *local_18;
  byte local_b;
  undefined1 local_a;
  
  local_c0 = in_RSI;
  zone = allocT<asmjit::v1_14::ConstPoolNode>(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  if (zone == (ConstPoolNode *)0x0) {
    local_b0 = (ConstPoolNode *)0x0;
  }
  else {
    local_a0 = 0x140;
    local_a8 = &local_d0;
    local_b0 = (ConstPoolNode *)0x0;
    if (zone != (ConstPoolNode *)0x0) {
      local_90 = *local_c0;
      local_94 = 0;
      local_3c = 0;
      local_23 = 0x10;
      local_24 = 0x40;
      local_22 = 0x50;
      local_21 = 3;
      *(undefined8 *)zone = 0;
      *(undefined8 *)(zone + 8) = 0;
      zone[0x10] = (ConstPoolNode)0x3;
      local_b = *(byte *)(local_90 + 0x1b0);
      zone[0x11] = (ConstPoolNode)(local_b | 0x50);
      zone[0x12] = (ConstPoolNode)0x0;
      zone[0x13] = (ConstPoolNode)0x0;
      *(undefined4 *)(zone + 0x14) = 0;
      *(undefined8 *)(zone + 0x18) = 0;
      *(undefined8 *)(zone + 0x20) = 0;
      *(undefined8 *)(zone + 0x28) = 0;
      *(undefined4 *)(zone + 0x30) = 0;
      pCVar1 = zone;
      local_d0 = zone;
      local_c8 = zone;
      local_88 = zone;
      local_38 = local_90;
      local_30 = zone;
      local_20 = local_90;
      local_18 = zone;
      local_a = local_22;
      ConstPool::ConstPool((ConstPool *)0x0,(Zone *)zone);
      zone[0x10] = (ConstPoolNode)0x8;
      zone[0x11] = (ConstPoolNode)((byte)zone[0x11] | 2);
      zone[0x11] = (ConstPoolNode)((byte)zone[0x11] & 0xee);
      local_b0 = pCVar1;
    }
  }
  return local_b0;
}

Assistant:

inline T* newT(Args&&... args) noexcept {
    void* p = allocT<T>();
    if (ASMJIT_UNLIKELY(!p))
      return nullptr;
    return new(Support::PlacementNew{p}) T(std::forward<Args>(args)...);
  }